

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_AtomIsNumericIndex1(JSContext *ctx,JSAtom atom)

{
  JSValue val;
  BOOL BVar1;
  int iVar2;
  byte *pbVar3;
  JSAtom in_ESI;
  JSContext *in_RDI;
  JSValue JVar4;
  uint8_t *r_end_1;
  uint8_t *r_1;
  uint16_t nfinity16 [7];
  uint16_t *r_end;
  uint16_t *r;
  JSValue str;
  JSValue num;
  int ret;
  int len;
  int c;
  JSString *p;
  JSAtomStruct *p1;
  JSRuntime *rt;
  JSValueUnion in_stack_ffffffffffffff08;
  JSContext *in_stack_ffffffffffffff10;
  JSContext *in_stack_ffffffffffffff18;
  JSValueUnion local_c8;
  int64_t local_c0;
  byte *local_b0;
  undefined8 local_a6;
  undefined4 local_9e;
  undefined2 local_9a;
  ushort *local_98;
  ushort *local_90;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  int local_64;
  uint local_60;
  uint local_5c;
  JSValueUnion local_58;
  JSValueUnion local_50;
  JSRuntime *local_48;
  JSAtom local_3c;
  JSContext *local_38;
  undefined1 local_30 [8];
  int64_t local_28;
  undefined4 uStack_c;
  
  local_48 = in_RDI->rt;
  local_3c = in_ESI;
  local_38 = in_RDI;
  BVar1 = __JS_AtomIsTaggedInt(in_ESI);
  if (BVar1 != 0) {
    local_30._0_4_ = __JS_AtomToUInt32(local_3c);
    local_30._4_4_ = uStack_c;
    local_28 = 0;
    return _local_30;
  }
  local_58 = (JSValueUnion)((JSValueUnion *)(local_48->atom_array + local_3c))->ptr;
  if ((uint)((ulong)*(undefined8 *)((long)local_58.ptr + 4) >> 0x3e) != 1) {
    local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
    local_28 = 3;
    return _local_30;
  }
  local_60 = (uint)*(undefined8 *)((long)local_58.ptr + 4) & 0x7fffffff;
  local_50 = local_58;
  if ((*(ulong *)((long)local_58.ptr + 4) >> 0x1f & 1) == 0) {
    local_b0 = (byte *)((long)local_58.ptr + 0x10);
    pbVar3 = (byte *)((long)local_58.ptr + (long)(int)local_60 + 0x10);
    if (pbVar3 <= local_b0) {
      local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
      local_28 = 3;
      return _local_30;
    }
    local_5c = (uint)*local_b0;
    if (local_5c == 0x2d) {
      if (pbVar3 <= local_b0) {
        local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
        local_28 = 3;
        return _local_30;
      }
      local_b0 = (byte *)((long)local_58.ptr + 0x11);
      local_5c = (uint)*local_b0;
      if ((local_5c == 0x30) && (local_60 == 2)) goto LAB_00130420;
    }
    iVar2 = is_num(local_5c);
    if ((iVar2 == 0) &&
       (((local_5c != 0x49 || ((long)pbVar3 - (long)local_b0 != 8)) ||
        (iVar2 = memcmp(local_b0 + 1,"nfinity",7), iVar2 != 0)))) {
      local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
      local_28 = 3;
      return _local_30;
    }
  }
  else {
    local_90 = (ushort *)((long)local_58.ptr + 0x10);
    local_98 = (ushort *)((long)local_58.ptr + (long)(int)local_60 * 2 + 0x10);
    if (local_98 <= local_90) {
      local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
      local_28 = 3;
      return _local_30;
    }
    local_5c = (uint)*local_90;
    if (local_5c == 0x2d) {
      if (local_98 <= local_90) {
        local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
        local_28 = 3;
        return _local_30;
      }
      local_90 = (ushort *)((long)local_58.ptr + 0x12);
      local_5c = (uint)*local_90;
      if ((local_5c == 0x30) && (local_60 == 2)) {
LAB_00130420:
        local_5c = 0x30;
        JVar4 = __JS_NewFloat64(local_38,-0.0);
        return JVar4;
      }
    }
    iVar2 = is_num(local_5c);
    if (iVar2 == 0) {
      local_a6 = 0x6e00690066006e;
      local_9e = 0x740069;
      local_9a = 0x79;
      if (((local_5c != 0x49) || ((long)local_98 - (long)local_90 >> 1 != 8)) ||
         (iVar2 = memcmp(local_90 + 1,&local_a6,0xe), iVar2 != 0)) {
        local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
        local_28 = 3;
        return _local_30;
      }
    }
  }
  JVar4.tag = -7;
  JVar4.u.ptr = local_58.ptr;
  JVar4 = JS_ToNumber(in_stack_ffffffffffffff18,JVar4);
  local_c8 = JVar4.u;
  local_78 = local_c8;
  local_c0 = JVar4.tag;
  local_70 = local_c0;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    val.tag = (int64_t)in_stack_ffffffffffffff10;
    val.u.float64 = in_stack_ffffffffffffff08.float64;
    JVar4 = JS_ToString((JSContext *)0x130566,val);
    local_88 = JVar4.u;
    local_80 = JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) {
      local_64 = js_string_compare((JSContext *)JVar4.tag,(JSString *)JVar4.u.ptr,
                                   (JSString *)in_stack_ffffffffffffff10);
      JS_FreeValue(in_stack_ffffffffffffff10,JVar4);
      if (local_64 == 0) {
        local_28 = local_70;
        local_30 = (undefined1  [8])local_78.ptr;
      }
      else {
        JS_FreeValue(in_stack_ffffffffffffff10,JVar4);
        local_30 = (undefined1  [8])(stack0xffffffffffffffd4 << 0x20);
        local_28 = 3;
      }
    }
    else {
      JS_FreeValue(in_stack_ffffffffffffff10,JVar4);
      local_28 = local_80;
      local_30 = (undefined1  [8])local_88.ptr;
    }
  }
  else {
    local_28 = local_70;
    local_30 = (undefined1  [8])local_78.ptr;
  }
  return _local_30;
}

Assistant:

static JSValue JS_AtomIsNumericIndex1(JSContext *ctx, JSAtom atom)
{
    JSRuntime *rt = ctx->rt;
    JSAtomStruct *p1;
    JSString *p;
    int c, len, ret;
    JSValue num, str;

    if (__JS_AtomIsTaggedInt(atom))
        return JS_NewInt32(ctx, __JS_AtomToUInt32(atom));
    assert(atom < rt->atom_size);
    p1 = rt->atom_array[atom];
    if (p1->atom_type != JS_ATOM_TYPE_STRING)
        return JS_UNDEFINED;
    p = p1;
    len = p->len;
    if (p->is_wide_char) {
        const uint16_t *r = p->u.str16, *r_end = p->u.str16 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2)
                goto minus_zero;
        }
        /* XXX: should test NaN, but the tests do not check it */
        if (!is_num(c)) {
            /* XXX: String should be normalized, therefore 8-bit only */
            const uint16_t nfinity16[7] = { 'n', 'f', 'i', 'n', 'i', 't', 'y' };
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, nfinity16, sizeof(nfinity16))))
                return JS_UNDEFINED;
        }
    } else {
        const uint8_t *r = p->u.str8, *r_end = p->u.str8 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2) {
            minus_zero:
                return __JS_NewFloat64(ctx, -0.0);
            }
        }
        if (!is_num(c)) {
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, "nfinity", 7)))
                return JS_UNDEFINED;
        }
    }
    /* XXX: bignum: would be better to only accept integer to avoid
       relying on current floating point precision */
    /* this is ECMA CanonicalNumericIndexString primitive */
    num = JS_ToNumber(ctx, JS_MKPTR(JS_TAG_STRING, p));
    if (JS_IsException(num))
        return num;
    str = JS_ToString(ctx, num);
    if (JS_IsException(str)) {
        JS_FreeValue(ctx, num);
        return str;
    }
    ret = js_string_compare(ctx, p, JS_VALUE_GET_STRING(str));
    JS_FreeValue(ctx, str);
    if (ret == 0) {
        return num;
    } else {
        JS_FreeValue(ctx, num);
        return JS_UNDEFINED;
    }
}